

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetAggregateOption
          (OptionInterpreter *this,FieldDescriptor *option_field,UnknownFieldSet *unknown_fields)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  Descriptor *type;
  Message *pMVar4;
  undefined4 extraout_var;
  LogMessage *pLVar5;
  UnknownFieldSet *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  string serial;
  AggregateErrorCollector collector;
  LogMessage local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  AggregateOptionFinder finder;
  Parser parser;
  MessageLite *this_00;
  
  this_02 = &serial;
  if (((this->uninterpreted_option_->_has_bits_).has_bits_[0] & 4) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&finder,
                   "Option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    std::operator+(&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&finder,
                   "\" is a message. To set the entire message, use syntax like \"");
    std::operator+(&serial,&local_98,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    option_field);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parser,
                   &serial,
                   " = { <proto text format> }\". To set fields within it, use syntax like \"");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&collector,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parser,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    option_field);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&collector,
                   ".foo = value\".");
    bVar1 = AddValueError(this,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&collector);
    std::__cxx11::string::~string((string *)&parser);
    std::__cxx11::string::~string((string *)&serial);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&finder);
  }
  else {
    type = FieldDescriptor::message_type(option_field);
    pMVar4 = DynamicMessageFactory::GetPrototype(&this->dynamic_factory_,type);
    iVar2 = (*(pMVar4->super_MessageLite)._vptr_MessageLite[3])(pMVar4);
    this_00 = (MessageLite *)CONCAT44(extraout_var,iVar2);
    if (this_00 == (MessageLite *)0x0) {
      internal::LogMessage::LogMessage
                (&local_d0,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                 ,0x1b5e);
      pLVar5 = internal::LogMessage::operator<<
                         (&local_d0,"CHECK failed: dynamic.get() != nullptr: ");
      pLVar5 = internal::LogMessage::operator<<(pLVar5,"Could not create an instance of ");
      FieldDescriptor::DebugString_abi_cxx11_((string *)&collector,option_field);
      pLVar5 = internal::LogMessage::operator<<(pLVar5,(string *)&collector);
      internal::LogFinisher::operator=((LogFinisher *)&parser,pLVar5);
      std::__cxx11::string::~string((string *)&collector);
      internal::LogMessage::~LogMessage(&local_d0);
    }
    collector.error_._M_dataplus._M_p = (pointer)&collector.error_.field_2;
    collector.super_ErrorCollector._vptr_ErrorCollector =
         (_func_int **)&PTR__AggregateErrorCollector_0064b010;
    collector.error_._M_string_length = 0;
    collector.error_.field_2._M_local_buf[0] = '\0';
    finder.super_Finder._vptr_Finder = (_func_int **)&PTR__Finder_0064b058;
    finder.builder_ = this->builder_;
    TextFormat::Parser::Parser(&parser);
    parser.error_collector_ = &collector.super_ErrorCollector;
    parser.finder_ = &finder.super_Finder;
    bVar1 = TextFormat::Parser::ParseFromString
                      (&parser,(this->uninterpreted_option_->aggregate_value_).ptr_,
                       (Message *)this_00);
    if (bVar1) {
      serial._M_dataplus._M_p = (pointer)&serial.field_2;
      serial._M_string_length = 0;
      serial.field_2._M_local_buf[0] = '\0';
      MessageLite::SerializeToString(this_00,&serial);
      TVar3 = FieldDescriptor::type(option_field);
      if (TVar3 == TYPE_MESSAGE) {
        UnknownFieldSet::AddLengthDelimited(unknown_fields,*(int *)(option_field + 0x44),&serial);
        this_02 = &serial;
      }
      else {
        TVar3 = FieldDescriptor::type(option_field);
        if (TVar3 != TYPE_GROUP) {
          internal::LogMessage::LogMessage
                    (&local_d0,LOGLEVEL_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                     ,0x1b72);
          pLVar5 = internal::LogMessage::operator<<
                             (&local_d0,
                              "CHECK failed: (option_field->type()) == (FieldDescriptor::TYPE_GROUP): "
                             );
          internal::LogFinisher::operator=((LogFinisher *)&local_98,pLVar5);
          internal::LogMessage::~LogMessage(&local_d0);
        }
        this_01 = UnknownFieldSet::AddGroup(unknown_fields,*(int *)(option_field + 0x44));
        UnknownFieldSet::ParseFromString(this_01,&serial);
      }
    }
    else {
      std::operator+(&local_98,"Error while parsing option value for \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      option_field);
      std::operator+(&serial,&local_98,"\": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0,
                     &serial,&collector.error_);
      AddValueError(this,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&serial);
      this_02 = &local_98;
    }
    std::__cxx11::string::~string((string *)this_02);
    TextFormat::Parser::~Parser(&parser);
    TextFormat::Finder::~Finder(&finder.super_Finder);
    anon_unknown_1::AggregateErrorCollector::~AggregateErrorCollector(&collector);
    if (this_00 != (MessageLite *)0x0) {
      (*this_00->_vptr_MessageLite[1])(this_00);
    }
  }
  return bVar1;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::SetAggregateOption(
    const FieldDescriptor* option_field, UnknownFieldSet* unknown_fields) {
  if (!uninterpreted_option_->has_aggregate_value()) {
    return AddValueError("Option \"" + option_field->full_name() +
                         "\" is a message. To set the entire message, use "
                         "syntax like \"" +
                         option_field->name() +
                         " = { <proto text format> }\". "
                         "To set fields within it, use "
                         "syntax like \"" +
                         option_field->name() + ".foo = value\".");
  }

  const Descriptor* type = option_field->message_type();
  std::unique_ptr<Message> dynamic(dynamic_factory_.GetPrototype(type)->New());
  GOOGLE_CHECK(dynamic.get() != nullptr)
      << "Could not create an instance of " << option_field->DebugString();

  AggregateErrorCollector collector;
  AggregateOptionFinder finder;
  finder.builder_ = builder_;
  TextFormat::Parser parser;
  parser.RecordErrorsTo(&collector);
  parser.SetFinder(&finder);
  if (!parser.ParseFromString(uninterpreted_option_->aggregate_value(),
                              dynamic.get())) {
    AddValueError("Error while parsing option value for \"" +
                  option_field->name() + "\": " + collector.error_);
    return false;
  } else {
    std::string serial;
    dynamic->SerializeToString(&serial);  // Never fails
    if (option_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      unknown_fields->AddLengthDelimited(option_field->number(), serial);
    } else {
      GOOGLE_CHECK_EQ(option_field->type(), FieldDescriptor::TYPE_GROUP);
      UnknownFieldSet* group = unknown_fields->AddGroup(option_field->number());
      group->ParseFromString(serial);
    }
    return true;
  }
}